

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_16_2_e751edba_conflict qclab::qgates::lambda_Hadamard<double>(Op op,double *vector)

{
  double dVar1;
  anon_class_16_2_e751edba_conflict aVar2;
  anon_class_16_2_e751edba_conflict f;
  R_conflict sqrt2;
  double *vector_local;
  Op op_local;
  
  dVar1 = sqrt(2.0);
  aVar2.sqrt2 = 1.0 / dVar1;
  aVar2.vector = vector;
  return aVar2;
}

Assistant:

auto lambda_Hadamard( Op op , T* vector ) {
    // operation
    using R = qclab::real_t< T > ;
    const R sqrt2 = R(1) / std::sqrt( R(2) ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = sqrt2 * x1 + sqrt2 * x2 ;
      vector[b] = sqrt2 * x1 - sqrt2 * x2 ;
    } ;
    return f ;
  }